

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

MemberIterator __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
DoFindMember<rapidjson::CrtAllocator>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *name)

{
  undefined8 this_00;
  bool bVar1;
  Pointer rhs;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *name_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  MemberIterator *member;
  
  local_28.data_.s.str = (Ch *)in_RDX;
  name_local = name;
  this_local = this;
  MemberBegin(this);
  while( true ) {
    MemberEnd(&local_28);
    bVar1 = GenericMemberIterator<false,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator!=((GenericMemberIterator<false,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)this,(GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&local_28);
    this_00 = local_28.data_.s.str;
    if (!bVar1) {
      return (MemberIterator)(Pointer)this;
    }
    rhs = GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::operator->((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)this);
    bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
            StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)this_00,
                       &rhs->name);
    if (bVar1) break;
    GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this);
  }
  return (MemberIterator)(Pointer)this;
}

Assistant:

MemberIterator DoFindMember(const GenericValue<Encoding, SourceAllocator>& name) {
        MemberIterator member = MemberBegin();
        for ( ; member != MemberEnd(); ++member)
            if (name.StringEqual(member->name))
                break;
        return member;
    }